

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sprite.cpp
# Opt level: O2

void __thiscall GLSprite::PutSprite(GLSprite *this,bool translucent)

{
  long lVar1;
  undefined7 in_register_00000031;
  
  lVar1 = 0x1b8;
  if (this->modelframe == (FSpriteModelFrame *)0x0) {
    lVar1 = 0x210;
  }
  if ((int)CONCAT71(in_register_00000031,translucent) != 0) {
    lVar1 = 0x210;
  }
  GLDrawList::AddSprite((GLDrawList *)((long)&gl_drawinfo->drawlists[0].walls.Array + lVar1),this);
  return;
}

Assistant:

inline void GLSprite::PutSprite(bool translucent)
{
	int list;
	// [BB] Allow models to be drawn in the GLDL_TRANSLUCENT pass.
	if (translucent || !modelframe)
	{
		list = GLDL_TRANSLUCENT;
	}
	else
	{
		list = GLDL_MODELS;
	}
	gl_drawinfo->drawlists[list].AddSprite(this);
}